

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

int xz_compressed(xzFile f)

{
  xz_statep state;
  xzFile f_local;
  
  if (f == (xzFile)0x0) {
    f_local._4_4_ = -1;
  }
  else if (*(int *)((long)f + 0x70) < 1) {
    f_local._4_4_ = -1;
  }
  else if (*(int *)((long)f + 0x50) == 1) {
    f_local._4_4_ = 0;
  }
  else if (*(int *)((long)f + 0x50) - 2U < 2) {
    f_local._4_4_ = 1;
  }
  else {
    f_local._4_4_ = -1;
  }
  return f_local._4_4_;
}

Assistant:

static int
xz_compressed(xzFile f) {
    xz_statep state;

    if (f == NULL)
        return(-1);
    state = (xz_statep) f;
    if (state->init <= 0)
        return(-1);

    switch (state->how) {
        case COPY:
	    return(0);
	case GZIP:
	case LZMA:
	    return(1);
    }
    return(-1);
}